

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddLanguageFlags(cmLocalGenerator *this,string *flags,string *lang,string *config)

{
  allocator local_49;
  undefined1 local_48 [8];
  string flagsVar;
  string *config_local;
  string *lang_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  flagsVar.field_2._8_8_ = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"CMAKE_",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=((string *)local_48,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_48,"_FLAGS");
  AddConfigVariableFlags(this,flags,(string *)local_48,(string *)flagsVar.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);
}